

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O0

bool __thiscall cmCacheManager::SaveCache(cmCacheManager *this,string *path,cmMessenger *messenger)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  char *pcVar5;
  ostream *poVar6;
  string *psVar7;
  CacheEntry *this_00;
  reference ppVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f0;
  undefined1 local_7d0 [8];
  ofstream checkCache;
  cmAlphaNum local_5c8;
  cmAlphaNum local_598;
  undefined1 local_568 [8];
  string checkCacheFile;
  string local_540;
  cmValue local_520;
  cmValue help_1;
  CacheEntryType t_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>
  *i_1;
  iterator __end1_1;
  iterator __begin1_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
  *__range1_1;
  string local_4e8;
  allocator<char> local_4c1;
  string local_4c0;
  cmValue local_4a0;
  cmValue help;
  CacheEntryType t;
  CacheEntry *ce;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>
  *i;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
  *__range1;
  string local_460;
  undefined1 local_440 [8];
  string currentcwd;
  allocator<char> local_3f9;
  string local_3f8;
  string local_3d8;
  allocator<char> local_3b1;
  string local_3b0;
  string local_390;
  allocator<char> local_369;
  string local_368;
  undefined4 local_344;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  undefined1 local_310 [8];
  cmGeneratedFileStream fout;
  cmAlphaNum local_78;
  undefined1 local_48 [8];
  string cacheFile;
  cmMessenger *messenger_local;
  string *path_local;
  cmCacheManager *this_local;
  
  cacheFile.field_2._8_8_ = messenger;
  cmAlphaNum::cmAlphaNum(&local_78,path);
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)&fout.field_0x260,"/CMakeCache.txt");
  cmStrCat<>((string *)local_48,&local_78,(cmAlphaNum *)&fout.field_0x260);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_310,(string *)local_48,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_310,true);
  bVar2 = std::ios::operator!((ios *)(local_310 + (long)*(_func_int **)((long)local_310 + -0x18)));
  if ((bVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_368,"CMAKE_CACHE_MAJOR_VERSION",&local_369);
    uVar4 = cmVersion::GetMajorVersion();
    std::__cxx11::to_string(&local_390,uVar4);
    AddCacheEntry(this,&local_368,&local_390,
                  "Major version of cmake used to create the current loaded cache",INTERNAL);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_368);
    std::allocator<char>::~allocator(&local_369);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3b0,"CMAKE_CACHE_MINOR_VERSION",&local_3b1);
    uVar4 = cmVersion::GetMinorVersion();
    std::__cxx11::to_string(&local_3d8,uVar4);
    AddCacheEntry(this,&local_3b0,&local_3d8,
                  "Minor version of cmake used to create the current loaded cache",INTERNAL);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::allocator<char>::~allocator(&local_3b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3f8,"CMAKE_CACHE_PATCH_VERSION",&local_3f9);
    uVar4 = cmVersion::GetPatchVersion();
    std::__cxx11::to_string((string *)((long)&currentcwd.field_2 + 8),uVar4);
    AddCacheEntry(this,&local_3f8,(string *)((long)&currentcwd.field_2 + 8),
                  "Patch version of cmake used to create the current loaded cache",INTERNAL);
    std::__cxx11::string::~string((string *)(currentcwd.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_3f8);
    std::allocator<char>::~allocator(&local_3f9);
    std::__cxx11::string::string((string *)local_440,(string *)path);
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_440);
    if ((('@' < *pcVar5) &&
        (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_440), *pcVar5 < '[')) &&
       (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_440), *pcVar5 == ':')) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_440);
      cVar1 = *pcVar5;
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_440);
      *pcVar5 = cVar1 + ' ';
    }
    cmsys::SystemTools::ConvertToUnixSlashes((string *)local_440);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_460,"CMAKE_CACHEFILE_DIR",(allocator<char> *)((long)&__range1 + 7));
    AddCacheEntry(this,&local_460,(string *)local_440,
                  "This is the directory where this CMakeCache.txt was created",INTERNAL);
    std::__cxx11::string::~string((string *)&local_460);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    poVar6 = std::operator<<((ostream *)local_310,
                             "# This is the CMakeCache file.\n# For build in directory: ");
    poVar6 = std::operator<<(poVar6,(string *)local_440);
    poVar6 = std::operator<<(poVar6,"\n# It was generated by CMake: ");
    psVar7 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    poVar6 = std::operator<<(poVar6,(string *)psVar7);
    std::operator<<(poVar6,
                    "\n# You can edit this file to change values found and used by cmake.\n# If you do not want to change any of the values, simply exit the editor.\n# If you do want to change a value, simply edit, save, and exit the editor.\n# The syntax for the file is as follows:\n# KEY:TYPE=VALUE\n# KEY is the name of a variable in the cache.\n# TYPE is a hint to GUIs for the type of VALUE, DO NOT EDIT TYPE!.\n# VALUE is the current value for the KEY.\n\n########################\n# EXTERNAL cache entries\n########################\n\n"
                   );
    __end1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
             ::begin(&this->Cache);
    i = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>
         *)std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
           ::end(&this->Cache);
    while (bVar3 = std::operator!=(&__end1,(_Self *)&i), bVar3) {
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>
               ::operator*(&__end1);
      this_00 = &ppVar8->second;
      help.Value._4_4_ = (ppVar8->second).Type;
      if ((((ppVar8->second).Initialized & 1U) != 0) && (help.Value._4_4_ != INTERNAL)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4c0,"HELPSTRING",&local_4c1);
        local_4a0 = CacheEntry::GetProperty(this_00,&local_4c0);
        std::__cxx11::string::~string((string *)&local_4c0);
        std::allocator<char>::~allocator(&local_4c1);
        bVar3 = cmValue::operator_cast_to_bool(&local_4a0);
        if (bVar3) {
          psVar7 = cmValue::operator*[abi_cxx11_(&local_4a0);
          OutputHelpString((ostream *)local_310,psVar7);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4e8,"Missing description",
                     (allocator<char> *)((long)&__range1_1 + 7));
          OutputHelpString((ostream *)local_310,&local_4e8);
          std::__cxx11::string::~string((string *)&local_4e8);
          std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_1 + 7));
        }
        OutputKey((ostream *)local_310,&ppVar8->first);
        poVar6 = std::operator<<((ostream *)local_310,':');
        psVar7 = cmState::CacheEntryTypeToString_abi_cxx11_(help.Value._4_4_);
        poVar6 = std::operator<<(poVar6,(string *)psVar7);
        std::operator<<(poVar6,'=');
        OutputValue((ostream *)local_310,&this_00->Value);
        std::operator<<((ostream *)local_310,'\n');
        OutputNewlineTruncationWarning
                  ((ostream *)local_310,&ppVar8->first,&this_00->Value,
                   (cmMessenger *)cacheFile.field_2._8_8_);
        std::operator<<((ostream *)local_310,'\n');
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>
      ::operator++(&__end1);
    }
    std::operator<<((ostream *)local_310,
                    "\n########################\n# INTERNAL cache entries\n########################\n\n"
                   );
    __end1_1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
               ::begin(&this->Cache);
    i_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>
           *)std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
             ::end(&this->Cache);
    while (bVar3 = std::operator!=(&__end1_1,(_Self *)&i_1), bVar3) {
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>
               ::operator*(&__end1_1);
      if (((ppVar8->second).Initialized & 1U) != 0) {
        help_1.Value._4_4_ = CacheEntry::GetType(&ppVar8->second);
        WritePropertyEntries
                  (this,(ostream *)local_310,&ppVar8->first,&ppVar8->second,
                   (cmMessenger *)cacheFile.field_2._8_8_);
        if (help_1.Value._4_4_ == INTERNAL) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_540,"HELPSTRING",
                     (allocator<char> *)(checkCacheFile.field_2._M_local_buf + 0xf));
          local_520 = CacheEntry::GetProperty(&ppVar8->second,&local_540);
          std::__cxx11::string::~string((string *)&local_540);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(checkCacheFile.field_2._M_local_buf + 0xf));
          bVar3 = cmValue::operator_cast_to_bool(&local_520);
          if (bVar3) {
            psVar7 = cmValue::operator*[abi_cxx11_(&local_520);
            OutputHelpString((ostream *)local_310,psVar7);
          }
          OutputKey((ostream *)local_310,&ppVar8->first);
          poVar6 = std::operator<<((ostream *)local_310,':');
          psVar7 = cmState::CacheEntryTypeToString_abi_cxx11_(help_1.Value._4_4_);
          poVar6 = std::operator<<(poVar6,(string *)psVar7);
          std::operator<<(poVar6,'=');
          psVar7 = CacheEntry::GetValue_abi_cxx11_(&ppVar8->second);
          OutputValue((ostream *)local_310,psVar7);
          std::operator<<((ostream *)local_310,'\n');
          psVar7 = CacheEntry::GetValue_abi_cxx11_(&ppVar8->second);
          OutputNewlineTruncationWarning
                    ((ostream *)local_310,&ppVar8->first,psVar7,
                     (cmMessenger *)cacheFile.field_2._8_8_);
        }
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>
      ::operator++(&__end1_1);
    }
    std::operator<<((ostream *)local_310,'\n');
    cmGeneratedFileStream::Close((cmGeneratedFileStream *)local_310);
    cmAlphaNum::cmAlphaNum(&local_598,path);
    cmAlphaNum::cmAlphaNum(&local_5c8,"/CMakeFiles");
    cmStrCat<>((string *)local_568,&local_598,&local_5c8);
    checkCache._504_8_ = cmsys::SystemTools::MakeDirectory((string *)local_568,(mode_t *)0x0);
    std::__cxx11::string::operator+=((string *)local_568,"/cmake.check_cache");
    pcVar5 = (char *)std::__cxx11::string::c_str();
    std::ofstream::ofstream(local_7d0,pcVar5,_S_out);
    bVar2 = std::ios::operator!((ios *)(local_7d0 + (long)*(_func_int **)((long)local_7d0 + -0x18)))
    ;
    bVar3 = (bVar2 & 1) != 0;
    if (bVar3) {
      std::operator+(&local_7f0,"Unable to open check cache file for write. ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568)
      ;
      cmSystemTools::Error(&local_7f0);
      std::__cxx11::string::~string((string *)&local_7f0);
    }
    else {
      std::operator<<((ostream *)local_7d0,
                      "# This file is generated by cmake for dependency checking of the CMakeCache.txt file\n"
                     );
    }
    this_local._7_1_ = !bVar3;
    local_344 = 1;
    std::ofstream::~ofstream(local_7d0);
    std::__cxx11::string::~string((string *)local_568);
    std::__cxx11::string::~string((string *)local_440);
  }
  else {
    std::operator+(&local_340,"Unable to open cache file for save. ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    cmSystemTools::Error(&local_340);
    std::__cxx11::string::~string((string *)&local_340);
    cmSystemTools::ReportLastSystemError("");
    this_local._7_1_ = false;
    local_344 = 1;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_310);
  std::__cxx11::string::~string((string *)local_48);
  return this_local._7_1_;
}

Assistant:

bool cmCacheManager::SaveCache(const std::string& path, cmMessenger* messenger)
{
  std::string cacheFile = cmStrCat(path, "/CMakeCache.txt");
  cmGeneratedFileStream fout(cacheFile);
  fout.SetCopyIfDifferent(true);
  if (!fout) {
    cmSystemTools::Error("Unable to open cache file for save. " + cacheFile);
    cmSystemTools::ReportLastSystemError("");
    return false;
  }
  // before writing the cache, update the version numbers
  // to the
  this->AddCacheEntry("CMAKE_CACHE_MAJOR_VERSION",
                      std::to_string(cmVersion::GetMajorVersion()),
                      "Major version of cmake used to create the "
                      "current loaded cache",
                      cmStateEnums::INTERNAL);
  this->AddCacheEntry("CMAKE_CACHE_MINOR_VERSION",
                      std::to_string(cmVersion::GetMinorVersion()),
                      "Minor version of cmake used to create the "
                      "current loaded cache",
                      cmStateEnums::INTERNAL);
  this->AddCacheEntry("CMAKE_CACHE_PATCH_VERSION",
                      std::to_string(cmVersion::GetPatchVersion()),
                      "Patch version of cmake used to create the "
                      "current loaded cache",
                      cmStateEnums::INTERNAL);

  // Let us store the current working directory so that if somebody
  // Copies it, he will not be surprised
  std::string currentcwd = path;
  if (currentcwd[0] >= 'A' && currentcwd[0] <= 'Z' && currentcwd[1] == ':') {
    // Cast added to avoid compiler warning. Cast is ok because
    // value is guaranteed to fit in char by the above if...
    currentcwd[0] = static_cast<char>(currentcwd[0] - 'A' + 'a');
  }
  cmSystemTools::ConvertToUnixSlashes(currentcwd);
  this->AddCacheEntry("CMAKE_CACHEFILE_DIR", currentcwd,
                      "This is the directory where this CMakeCache.txt"
                      " was created",
                      cmStateEnums::INTERNAL);

  /* clang-format off */
  fout << "# This is the CMakeCache file.\n"
          "# For build in directory: " << currentcwd << "\n"
          "# It was generated by CMake: "
       << cmSystemTools::GetCMakeCommand()
       << "\n"
          "# You can edit this file to change values found and used by cmake."
          "\n"
          "# If you do not want to change any of the values, simply exit the "
          "editor.\n"
          "# If you do want to change a value, simply edit, save, and exit "
          "the editor.\n"
          "# The syntax for the file is as follows:\n"
          "# KEY:TYPE=VALUE\n"
          "# KEY is the name of a variable in the cache.\n"
          "# TYPE is a hint to GUIs for the type of VALUE, DO NOT EDIT TYPE!."
          "\n"
          "# VALUE is the current value for the KEY.\n"
          "\n"
          "########################\n"
          "# EXTERNAL cache entries\n"
          "########################\n"
          "\n";
  /* clang-format on */

  for (auto const& i : this->Cache) {
    CacheEntry const& ce = i.second;
    cmStateEnums::CacheEntryType t = ce.Type;
    if (!ce.Initialized) {
      /*
        // This should be added in, but is not for now.
      cmSystemTools::Error("Cache entry \"" + i.first + "\" is uninitialized");
      */
    } else if (t != cmStateEnums::INTERNAL) {
      // Format is key:type=value
      if (cmValue help = ce.GetProperty("HELPSTRING")) {
        cmCacheManager::OutputHelpString(fout, *help);
      } else {
        cmCacheManager::OutputHelpString(fout, "Missing description");
      }
      cmCacheManager::OutputKey(fout, i.first);
      fout << ':' << cmState::CacheEntryTypeToString(t) << '=';
      cmCacheManager::OutputValue(fout, ce.Value);
      fout << '\n';
      cmCacheManager::OutputNewlineTruncationWarning(fout, i.first, ce.Value,
                                                     messenger);
      fout << '\n';
    }
  }

  fout << "\n"
          "########################\n"
          "# INTERNAL cache entries\n"
          "########################\n"
          "\n";

  for (auto const& i : this->Cache) {
    if (!i.second.Initialized) {
      continue;
    }

    cmStateEnums::CacheEntryType t = i.second.GetType();
    this->WritePropertyEntries(fout, i.first, i.second, messenger);
    if (t == cmStateEnums::INTERNAL) {
      // Format is key:type=value
      if (cmValue help = i.second.GetProperty("HELPSTRING")) {
        cmCacheManager::OutputHelpString(fout, *help);
      }
      cmCacheManager::OutputKey(fout, i.first);
      fout << ':' << cmState::CacheEntryTypeToString(t) << '=';
      cmCacheManager::OutputValue(fout, i.second.GetValue());
      fout << '\n';
      cmCacheManager::OutputNewlineTruncationWarning(
        fout, i.first, i.second.GetValue(), messenger);
    }
  }
  fout << '\n';
  fout.Close();
  std::string checkCacheFile = cmStrCat(path, "/CMakeFiles");
  cmSystemTools::MakeDirectory(checkCacheFile);
  checkCacheFile += "/cmake.check_cache";
  cmsys::ofstream checkCache(checkCacheFile.c_str());
  if (!checkCache) {
    cmSystemTools::Error("Unable to open check cache file for write. " +
                         checkCacheFile);
    return false;
  }
  checkCache << "# This file is generated by cmake for dependency checking "
                "of the CMakeCache.txt file\n";
  return true;
}